

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3_drop_modules(sqlite3 *db,char **azNames)

{
  void *pvVar1;
  char *__s2;
  int iVar2;
  HashElem *pHVar3;
  char **ppcVar4;
  bool bVar5;
  
  pHVar3 = (db->aModule).first;
  if (pHVar3 != (HashElem *)0x0) {
    do {
      pvVar1 = pHVar3->data;
      pHVar3 = pHVar3->next;
      if (azNames == (char **)0x0) {
LAB_0013e935:
        createModule(db,*(char **)((long)pvVar1 + 8),(sqlite3_module *)0x0,(void *)0x0,
                     (_func_void_void_ptr *)0x0);
      }
      else {
        bVar5 = *azNames == (char *)0x0;
        if (bVar5) goto LAB_0013e935;
        __s2 = *(char **)((long)pvVar1 + 8);
        iVar2 = strcmp(*azNames,__s2);
        ppcVar4 = azNames + 1;
        while (iVar2 != 0) {
          bVar5 = *ppcVar4 == (char *)0x0;
          if (bVar5) goto LAB_0013e935;
          iVar2 = strcmp(*ppcVar4,__s2);
          ppcVar4 = ppcVar4 + 1;
        }
        if (bVar5) goto LAB_0013e935;
      }
    } while (pHVar3 != (HashElem *)0x0);
  }
  return 0;
}

Assistant:

SQLITE_API int sqlite3_drop_modules(sqlite3 *db, const char** azNames){
  HashElem *pThis, *pNext;
#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) ) return SQLITE_MISUSE_BKPT;
#endif
  for(pThis=sqliteHashFirst(&db->aModule); pThis; pThis=pNext){
    Module *pMod = (Module*)sqliteHashData(pThis);
    pNext = sqliteHashNext(pThis);
    if( azNames ){
      int ii;
      for(ii=0; azNames[ii]!=0 && strcmp(azNames[ii],pMod->zName)!=0; ii++){}
      if( azNames[ii]!=0 ) continue;
    }
    createModule(db, pMod->zName, 0, 0, 0);
  }
  return SQLITE_OK;
}